

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O1

uint64_t pac_time_until_deferred_work(tsdn_t *tsdn,pai_t *self)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  
  sVar2 = duckdb_je_eset_npages_get((eset_t *)(self + 3));
  sVar3 = duckdb_je_eset_npages_get((eset_t *)&self[0xaf].shrink);
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)&self[0x418].dalloc);
  if (iVar1 == 0) {
    self[0x418].expand = self[0x418].expand + 1;
    if ((tsdn_t *)self[0x418].alloc_batch != tsdn) {
      self[0x418].alloc_batch =
           (_func_size_t_tsdn_t_ptr_pai_t_ptr_size_t_size_t_edata_list_active_t_ptr__Bool__Bool_ptr
            *)tsdn;
      self[0x418].alloc = self[0x418].alloc + 1;
    }
    uVar4 = duckdb_je_decay_ns_until_purge((decay_t *)&self[0x417].expand,sVar3 + sVar2,0x400);
    *(undefined1 *)&self[0x418].shrink = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&self[0x418].dalloc);
  }
  else {
    uVar4 = 0;
  }
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    sVar2 = duckdb_je_eset_npages_get((eset_t *)&self[0x15e].alloc_batch);
    sVar3 = duckdb_je_eset_npages_get((eset_t *)&self[0x20a].dalloc);
    iVar1 = pthread_mutex_trylock((pthread_mutex_t *)&self[0x438].shrink);
    if (iVar1 == 0) {
      self[0x438].alloc_batch = self[0x438].alloc_batch + 1;
      if ((tsdn_t *)self[0x438].alloc != tsdn) {
        self[0x438].alloc =
             (_func_edata_t_ptr_tsdn_t_ptr_pai_t_ptr_size_t_size_t__Bool__Bool__Bool__Bool_ptr *)
             tsdn;
        self[0x437].time_until_deferred_work = self[0x437].time_until_deferred_work + 1;
      }
      uVar5 = duckdb_je_decay_ns_until_purge
                        ((decay_t *)&self[0x437].alloc_batch,sVar3 + sVar2,0x400);
      *(undefined1 *)&self[0x438].expand = 0;
      pthread_mutex_unlock((pthread_mutex_t *)&self[0x438].shrink);
    }
    else {
      uVar5 = 0;
    }
    if (uVar5 < uVar4) {
      uVar4 = uVar5;
    }
  }
  return uVar4;
}

Assistant:

static uint64_t
pac_time_until_deferred_work(tsdn_t *tsdn, pai_t *self) {
	uint64_t time;
	pac_t *pac = (pac_t *)self;

	time = pac_ns_until_purge(tsdn,
	    &pac->decay_dirty,
	    ecache_npages_get(&pac->ecache_dirty));
	if (time == BACKGROUND_THREAD_DEFERRED_MIN) {
		return time;
	}

	uint64_t muzzy = pac_ns_until_purge(tsdn,
	    &pac->decay_muzzy,
	    ecache_npages_get(&pac->ecache_muzzy));
	if (muzzy < time) {
		time = muzzy;
	}
	return time;
}